

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void expr_primary(LexState *ls,ExpDesc *v)

{
  BCLine line;
  int iVar1;
  BCReg BVar2;
  FuncState *fs;
  BCReg BVar3;
  BCReg BVar4;
  GCstr *name;
  uint uVar5;
  ExpDesc key;
  
  fs = ls->fs;
  if (ls->token == 0x11f) {
    name = lex_str(ls);
    var_lookup_(fs,name,v,1);
  }
  else {
    if (ls->token != 0x28) {
      err_syntax(ls,LJ_ERR_XSYMBOL);
    }
    line = ls->linenumber;
    lj_lex_next(ls);
    expr(ls,v);
    lex_match(ls,0x29,0x28,line);
    expr_discharge(ls->fs,v);
  }
LAB_00119336:
  do {
    while( true ) {
      iVar1 = ls->token;
      if ((iVar1 != 0x28) && (iVar1 != 0x120)) break;
LAB_0011936e:
      expr_tonextreg(fs,v);
      parse_args(ls,v);
    }
    if (iVar1 == 0x3a) {
      lj_lex_next(ls);
      key.k = VKSTR;
      key.t = 0xffffffff;
      key.f = 0xffffffff;
      key.u.sval = lex_str(ls);
      BVar3 = expr_toanyreg(fs,v);
      expr_free(fs,v);
      BVar2 = fs->freereg;
      uVar5 = BVar2 * 0x100;
      bcemit_INS(fs,BVar3 << 0x10 | uVar5 + 0x110);
      BVar4 = const_str(fs,&key);
      if (BVar4 < 0x100) {
        bcreg_reserve(fs,2);
        bcemit_INS(fs,uVar5 | BVar4 << 0x10 | BVar3 << 0x18 | 0x37);
      }
      else {
        bcreg_reserve(fs,3);
        bcemit_INS(fs,BVar4 << 0x10 | (BVar2 + 2) * 0x100 | 0x25);
        bcemit_INS(fs,BVar3 << 0x18 | uVar5 | (BVar2 + 2) * 0x10000 | 0x36);
        fs->freereg = fs->freereg - 1;
      }
      (v->u).s.info = BVar2;
      v->k = VNONRELOC;
      parse_args(ls,v);
      goto LAB_00119336;
    }
    if (iVar1 == 0x5b) {
      expr_toanyreg(fs,v);
      expr_bracket(ls,&key);
      expr_index(fs,v,&key);
    }
    else {
      if (iVar1 == 0x7b) goto LAB_0011936e;
      if (iVar1 != 0x2e) {
        return;
      }
      expr_field(ls,v);
    }
  } while( true );
}

Assistant:

static void expr_primary(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  /* Parse prefix expression. */
  if (ls->token == '(') {
    BCLine line = ls->linenumber;
    lj_lex_next(ls);
    expr(ls, v);
    lex_match(ls, ')', '(', line);
    expr_discharge(ls->fs, v);
  } else if (ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) {
    var_lookup(ls, v);
  } else {
    err_syntax(ls, LJ_ERR_XSYMBOL);
  }
  for (;;) {  /* Parse multiple expression suffixes. */
    if (ls->token == '.') {
      expr_field(ls, v);
    } else if (ls->token == '[') {
      ExpDesc key;
      expr_toanyreg(fs, v);
      expr_bracket(ls, &key);
      expr_index(fs, v, &key);
    } else if (ls->token == ':') {
      ExpDesc key;
      lj_lex_next(ls);
      expr_str(ls, &key);
      bcemit_method(fs, v, &key);
      parse_args(ls, v);
    } else if (ls->token == '(' || ls->token == TK_string || ls->token == '{') {
      expr_tonextreg(fs, v);
      parse_args(ls, v);
    } else {
      break;
    }
  }
}